

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O0

void __thiscall
imrt::Station::revert
          (Station *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  bool bVar1;
  mapped_type *pmVar2;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *in_RSI;
  long in_RDI;
  pair<int,_int> a;
  pair<int,_double> let;
  iterator __end2;
  iterator __begin2;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range2;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_40;
  int iStack_3c;
  _Self local_28;
  _Self local_20;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *this_00;
  
  this_00 = in_RSI;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                 (in_stack_ffffffffffffffa8);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                 (in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::_List_iterator<std::pair<int,_double>_>::operator*
              ((_List_iterator<std::pair<int,_double>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    pmVar2 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[](this_00,(key_type_conflict *)in_RSI);
    local_40 = (*pmVar2).first;
    iStack_3c = (*pmVar2).second;
    maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_40,iStack_3c);
    change_intensity((Station *)__range2,__begin2._M_node._4_4_,(int)__begin2._M_node,
                     (double)__end2._M_node,
                     (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     let.second);
    std::_List_iterator<std::pair<int,_double>_>::operator++(&local_20);
    in_stack_ffffffffffffffb0 = local_40;
    in_stack_ffffffffffffffb4 = iStack_3c;
  }
  return;
}

Assistant:

void revert(list< pair< int, double > >& diff){
    for(auto let:diff){
      pair <int,int> a = beam2pos[let.first];
      change_intensity(a.first, a.second, I(a.first, a.second) - let.second);
    }
  }